

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O2

int update_demo_menu(DEMO_MENU *menu)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  DEMO_MENU *pDVar6;
  bool bVar7;
  
  update_background();
  update_credits();
  lVar5 = (long)selected_item;
  pDVar6 = menu;
  if (lVar5 != -1) {
    (*menu[lVar5].proc)(menu + lVar5,3,0);
  }
  while (pDVar6->proc != (_func_int_DEMO_MENU_ptr_int_int *)0x0) {
    iVar2 = (*pDVar6->proc)(pDVar6,6,0);
    pDVar6 = pDVar6 + 1;
    if (iVar2 == 0x3ea) {
      locked = '\0';
      return 1000;
    }
  }
  if (locked != '\0') {
    return 1000;
  }
  _Var1 = key_pressed(0x3b);
  if (_Var1) {
    return 0x3e9;
  }
  _Var1 = mouse_button_pressed(1);
  if (_Var1) {
    iVar2 = 0;
    for (pDVar6 = menu; pDVar6->proc != (_func_int_DEMO_MENU_ptr_int_int *)0x0; pDVar6 = pDVar6 + 1)
    {
      iVar3 = mouse_x();
      if ((((pDVar6->x <= iVar3) && (iVar3 = mouse_y(), pDVar6->y <= iVar3)) &&
          (iVar3 = mouse_x(), iVar3 < pDVar6->w + pDVar6->x)) &&
         ((iVar3 = mouse_y(), iVar3 < pDVar6->h + pDVar6->y &&
          (uVar4 = pDVar6->flags, (uVar4 & 1) != 0)))) {
        if ((long)selected_item != -1) {
          *(byte *)&menu[selected_item].flags = (byte)menu[selected_item].flags & 0xfd;
          uVar4 = pDVar6->flags;
        }
        selected_item = iVar2;
        pDVar6->flags = uVar4 | 2;
        play_sound_id(7,0xff,0x80,-100,0);
        iVar2 = (*pDVar6->proc)(pDVar6,2,0xd);
        return iVar2;
      }
      iVar2 = iVar2 + 1;
    }
  }
  _Var1 = key_pressed(0x54);
  if (selected_item != -1 && _Var1) {
    lVar5 = (long)selected_item;
    iVar2 = selected_item;
    do {
      if (iVar2 < 1) {
        iVar2 = item_count;
      }
      iVar2 = iVar2 + -1;
    } while ((menu[iVar2].flags & 1) == 0);
    bVar7 = selected_item != iVar2;
    selected_item = iVar2;
    if (bVar7) {
      *(byte *)&menu[lVar5].flags = (byte)menu[lVar5].flags & 0xfd;
      *(byte *)&menu[iVar2].flags = (byte)menu[iVar2].flags | 2;
      play_sound_id(7,0xff,0x80,-100,0);
    }
  }
  _Var1 = key_pressed(0x55);
  if (selected_item != -1 && _Var1) {
    lVar5 = (long)selected_item;
    iVar2 = selected_item;
    do {
      iVar2 = iVar2 + 1;
      if (item_count <= iVar2) {
        iVar2 = 0;
      }
    } while ((menu[iVar2].flags & 1) == 0);
    bVar7 = selected_item != iVar2;
    selected_item = iVar2;
    if (bVar7) {
      *(byte *)&menu[lVar5].flags = (byte)menu[lVar5].flags & 0xfd;
      *(byte *)&menu[iVar2].flags = (byte)menu[iVar2].flags | 2;
      play_sound_id(7,0xff,0x80,-100,0);
    }
  }
  iVar3 = unicode_char(true);
  _Var1 = gamepad_button();
  iVar2 = 0x20;
  if (!_Var1) {
    iVar2 = iVar3;
  }
  lVar5 = (long)selected_item;
  if (iVar2 == 0 || lVar5 == -1) {
    return 1000;
  }
  iVar2 = (*menu[lVar5].proc)(menu + lVar5,2,iVar2);
  if (iVar2 == 0x3ea) {
    locked = '\x01';
    return 1000;
  }
  locked = '\0';
  return iVar2;
}

Assistant:

int update_demo_menu(DEMO_MENU * menu)
{
   int tmp, c;

   update_background();
   update_credits();
   
   if (selected_item != -1) {
      menu[selected_item].proc(&menu[selected_item], DEMO_MENU_MSG_KEY, 0);
   }

   for (tmp = 0; menu[tmp].proc != 0; tmp++) {
      if (menu[tmp].proc(&menu[tmp], DEMO_MENU_MSG_TICK, 0) == DEMO_MENU_LOCK) {
         locked = 0;
         return DEMO_MENU_CONTINUE;
      }
   }

   if (locked == 1) {
      return DEMO_MENU_CONTINUE;
   }

   if (key_pressed(ALLEGRO_KEY_ESCAPE)) {
      return DEMO_MENU_BACK;
   }
   
   /* If a mouse button is pressed, select the item under it and send a
    * DEMO_MENU_MSG_CHAR with 13 to it (which is the same effect as hitting
    * the return key).
    */
   if (mouse_button_pressed(1)) {
      int i;
      for (i = 0; menu[i].proc != NULL; i++) {
         if (mouse_x() >= menu[i].x && mouse_y() >= menu[i].y &&
               mouse_x() < menu[i].x + menu[i].w &&
               mouse_y() < menu[i].y + menu[i].h) {
            if (menu[i].flags & DEMO_MENU_SELECTABLE) {
               if (selected_item != -1) {
                  menu[selected_item].flags &= ~DEMO_MENU_SELECTED;
               }
               selected_item = i;
               menu[i].flags |= DEMO_MENU_SELECTED;
               play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
               return menu[i].proc(&menu[i], DEMO_MENU_MSG_CHAR, 13);
            }
         }
      }
   }

   if (key_pressed(ALLEGRO_KEY_UP)) {
      if (selected_item != -1) {
         tmp = selected_item;

         while (1) {
            --selected_item;
            if (selected_item < 0) {
               selected_item = item_count - 1;
            }

            if (menu[selected_item].flags & DEMO_MENU_SELECTABLE) {
               break;
            }
         }

         if (tmp != selected_item) {
            menu[tmp].flags &= ~DEMO_MENU_SELECTED;
            menu[selected_item].flags |= DEMO_MENU_SELECTED;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation,
                       0);
         }
      }
   }
    
   if (key_pressed(ALLEGRO_KEY_DOWN)) {
      if (selected_item != -1) {
         tmp = selected_item;

         while (1) {
            ++selected_item;
            if (selected_item >= item_count) {
               selected_item = 0;
            }

            if (menu[selected_item].flags & DEMO_MENU_SELECTABLE) {
               break;
            }
         }

         if (tmp != selected_item) {
            menu[tmp].flags &= ~DEMO_MENU_SELECTED;
            menu[selected_item].flags |= DEMO_MENU_SELECTED;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation,
                       0);
         }
      }
   }
    
    c = unicode_char(true);
    if(gamepad_button()) {
        c = 32;
    }

   if (selected_item != -1 && c) {
      tmp = menu[selected_item].proc(&menu[selected_item],
         DEMO_MENU_MSG_CHAR, c);
      if (tmp == DEMO_MENU_LOCK) {
         locked = 1;
         return DEMO_MENU_CONTINUE;
      } else {
         locked = 0;
         return tmp;
      }
   }

   return DEMO_MENU_CONTINUE;
}